

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

bool deqp::gles3::Functional::reverifyConstantDerivateWithFlushRelaxations
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Precision precision,Vec4 *derivScale,Vec4 *derivBias,
               Vec4 *surfaceThreshold,DerivateFunc derivateFunc,Linear2DFunctionEvaluator *function)

{
  undefined1 auVar1 [16];
  Float<unsigned_int,_8,_23,_127,_3U> FVar2;
  Float<unsigned_int,_8,_23,_127,_3U> FVar3;
  Float<unsigned_int,_8,_23,_127,_3U> FVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  Float<unsigned_int,_8,_23,_127,_3U> FVar6;
  float *pfVar7;
  Vec4 *pVVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  float v_2;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar25;
  undefined1 auVar24 [16];
  float v;
  float fVar26;
  uint uVar27;
  uint uVar29;
  double dVar28;
  uint uVar30;
  double dVar31;
  uint uVar35;
  double dVar32;
  double dVar33;
  uint uVar36;
  uint uVar37;
  undefined1 auVar34 [16];
  Vec4 functionValueBackward;
  Vec4 functionValueForward;
  Interval backwardComponent;
  Interval numerator;
  Interval forwardComponent;
  Vec4 resultDerivative;
  Interval numeratorRange;
  Interval divisionRange;
  byte local_359;
  ulong local_358;
  int local_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  ulong local_328;
  float local_320;
  DataType local_31c;
  undefined1 local_318 [16];
  TextureFormat local_308;
  float local_300;
  float local_2fc;
  int local_2f8;
  int local_2f4;
  float local_2f0;
  float local_2ec;
  PixelBufferAccess *local_2e8;
  ulong local_2e0;
  float local_2d8 [8];
  double local_2b8;
  undefined8 uStack_2b0;
  Vec4 *local_2a0;
  ulong local_298;
  ulong local_290;
  ConstPixelBufferAccess *local_288;
  Interval local_280;
  undefined1 local_268 [24];
  TextureFormat local_250;
  TextureFormat local_248;
  Interval local_240;
  undefined1 local_228 [16];
  Interval local_210;
  IVec4 local_1f8;
  IVec4 local_1e8;
  Interval local_1d0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  double dStack_1a8;
  ios_base local_140 [272];
  
  local_1e8.m_data[0] = 0xff;
  local_1e8.m_data[1] = 0;
  local_1e8.m_data[2] = 0;
  local_1e8.m_data[3] = 0xff;
  local_1f8.m_data[0] = 0;
  local_1f8.m_data[1] = 0xff;
  local_1f8.m_data[2] = 0;
  local_1f8.m_data[3] = 0xff;
  local_308 = (TextureFormat)log;
  local_2e8 = errorMask;
  local_2a0 = derivScale;
  local_31c = glu::getDataTypeFloatScalars(dataType);
  iVar13 = 0;
  uVar15 = 0;
  iVar16 = 0;
  if (precision < PRECISION_LAST) {
    uVar15 = (ulong)*(uint *)(&DAT_00b1ab08 + (ulong)precision * 4);
    iVar16 = *(int *)(&DAT_00b1ab14 + (ulong)precision * 4);
  }
  tcu::clear(local_2e8,&local_1f8);
  iVar17 = (result->m_size).m_data[1];
  if (0 < iVar17) {
    iVar12 = (int)uVar15 + -3;
    iVar9 = (result->m_size).m_data[0];
    local_298 = (ulong)local_31c;
    local_358 = 0;
    iVar13 = 0;
    local_2f8 = iVar12;
    local_2f4 = iVar16;
    local_290 = uVar15;
    local_288 = result;
    do {
      if (0 < iVar9) {
        local_2fc = (float)(int)local_358;
        local_300 = local_2fc + 2.0;
        local_320 = local_2fc + 0.5;
        local_2fc = local_2fc + -1.0;
        iVar17 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1b8,(int)result,iVar17,(int)local_358);
          auVar20._0_4_ = (float)local_1b8._0_4_ - derivBias->m_data[0];
          auVar20._4_4_ = (float)local_1b8._4_4_ - derivBias->m_data[1];
          auVar20._8_4_ = (float)uStack_1b0 - derivBias->m_data[2];
          auVar20._12_4_ = uStack_1b0._4_4_ - derivBias->m_data[3];
          local_228 = divps(auVar20,*(undefined1 (*) [16])local_2a0->m_data);
          fVar19 = (float)iVar17;
          if (derivateFunc == DERIVATE_DFDX) {
            local_1b8._4_4_ = local_320;
            local_1b8._0_4_ = fVar19 + 2.0;
            local_2d8[4] = 0.0;
            local_2d8[5] = 0.0;
            local_2d8[6] = 0.0;
            local_2d8[7] = 0.0;
            lVar10 = 0;
            pfVar7 = (float *)function;
            do {
              fVar26 = 0.0;
              lVar11 = 0;
              do {
                fVar26 = fVar26 + pfVar7[lVar11] * *(float *)(local_1b8 + lVar11);
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0xc);
              local_2d8[lVar10 + 4] = fVar26;
              lVar10 = lVar10 + 1;
              pfVar7 = pfVar7 + 1;
            } while (lVar10 != 4);
          }
          else {
            local_1b8._4_4_ = local_300;
            local_1b8._0_4_ = fVar19 + 0.5;
            local_2d8[4] = 0.0;
            local_2d8[5] = 0.0;
            local_2d8[6] = 0.0;
            local_2d8[7] = 0.0;
            lVar10 = 0;
            pfVar7 = (float *)function;
            do {
              fVar26 = 0.0;
              lVar11 = 0;
              do {
                fVar26 = fVar26 + pfVar7[lVar11] * *(float *)(local_1b8 + lVar11);
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0xc);
              local_2d8[lVar10 + 4] = fVar26;
              lVar10 = lVar10 + 1;
              pfVar7 = pfVar7 + 1;
            } while (lVar10 != 4);
          }
          if (derivateFunc == DERIVATE_DFDX) {
            local_1b8._4_4_ = local_320;
            local_1b8._0_4_ = fVar19 + -1.0;
            local_2d8[0] = 0.0;
            local_2d8[1] = 0.0;
            local_2d8[2] = 0.0;
            local_2d8[3] = 0.0;
            lVar10 = 0;
            pfVar7 = (float *)function;
            do {
              auVar22 = ZEXT816(0);
              lVar11 = 0;
              do {
                auVar22._0_4_ = auVar22._0_4_ + pfVar7[lVar11] * *(float *)(local_1b8 + lVar11);
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0xc);
              local_2d8[lVar10] = auVar22._0_4_;
              lVar10 = lVar10 + 1;
              pfVar7 = pfVar7 + 1;
            } while (lVar10 != 4);
          }
          else {
            local_1b8._4_4_ = local_2fc;
            local_1b8._0_4_ = fVar19 + 0.5;
            local_2d8[0] = 0.0;
            local_2d8[1] = 0.0;
            local_2d8[2] = 0.0;
            local_2d8[3] = 0.0;
            lVar10 = 0;
            pfVar7 = (float *)function;
            do {
              auVar21 = ZEXT816(0);
              lVar11 = 0;
              do {
                auVar21._0_4_ = auVar21._0_4_ + pfVar7[lVar11] * *(float *)(local_1b8 + lVar11);
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0xc);
              local_2d8[lVar10] = auVar21._0_4_;
              lVar10 = lVar10 + 1;
              pfVar7 = pfVar7 + 1;
            } while (lVar10 != 4);
          }
          uStack_1b0 = (double)CONCAT44(uStack_1b0._4_4_,0x3f800000);
          local_34c = iVar17;
          if (0 < (int)local_31c) {
            uVar18 = 0;
            local_2e0 = 0;
            do {
              local_318._0_4_ = local_2d8[uVar18 + 4];
              local_328 = uVar18;
              fVar19 = addErrorUlp(local_2d8[uVar18 + 4],-0.5,iVar12);
              iVar17 = (int)uVar15;
              fVar19 = convertFloatFlushToZeroRtn(fVar19,iVar16,iVar17);
              local_348._0_4_ = fVar19;
              local_338._0_8_ = INFINITY;
              if (!NAN(fVar19)) {
                local_338._0_8_ = (double)fVar19;
              }
              local_338._8_8_ = 0;
              local_2b8 = -INFINITY;
              if (!NAN(fVar19)) {
                local_2b8 = (double)fVar19;
              }
              uStack_2b0 = 0;
              fVar19 = addErrorUlp((float)local_318._0_4_,0.5,iVar12);
              fVar19 = convertFloatFlushToZeroRtn(-fVar19,iVar16,iVar17);
              dVar31 = -INFINITY;
              dVar32 = INFINITY;
              if (!NAN(fVar19)) {
                dVar31 = (double)-fVar19;
                dVar32 = dVar31;
              }
              local_240.m_hasNaN = NAN((float)local_348._0_4_) || NAN(fVar19);
              uVar15 = -(ulong)(local_338._0_8_ <= dVar32);
              auVar23._0_8_ = ~uVar15 & (ulong)dVar32;
              auVar23._8_8_ = 0;
              auVar1._8_4_ = local_338._8_4_;
              auVar1._0_8_ = (ulong)local_338._0_8_ & uVar15;
              auVar1._12_4_ = local_338._12_4_;
              local_338 = auVar23 | auVar1;
              local_240.m_lo = local_338._0_8_;
              local_240.m_hi =
                   (double)(~-(ulong)(dVar31 <= local_2b8) & (ulong)dVar31 |
                           (ulong)local_2b8 & -(ulong)(dVar31 <= local_2b8));
              local_2f0 = local_2d8[local_328];
              fVar19 = addErrorUlp(local_2f0,-0.5,iVar12);
              local_2ec = convertFloatFlushToZeroRtn(fVar19,iVar16,iVar17);
              local_348._0_8_ = -INFINITY;
              local_318._0_8_ = INFINITY;
              if (!NAN(local_2ec)) {
                local_348._0_8_ = (undefined8)local_2ec;
                local_318._0_8_ = local_348._0_8_;
              }
              local_318._8_8_ = 0;
              local_348._8_8_ = 0;
              local_2b8 = (double)CONCAT44(local_2b8._4_4_,iVar13);
              fVar19 = addErrorUlp(local_2f0,0.5,iVar12);
              fVar19 = convertFloatFlushToZeroRtn(-fVar19,iVar16,iVar17);
              dVar31 = INFINITY;
              dVar32 = -INFINITY;
              if (!NAN(fVar19)) {
                dVar31 = (double)-fVar19;
                dVar32 = dVar31;
              }
              local_280.m_hasNaN = NAN(local_2ec) || NAN(fVar19);
              local_280.m_lo =
                   (double)(~-(ulong)((double)local_318._0_8_ <= dVar31) & (ulong)dVar31 |
                           local_318._0_8_ & -(ulong)((double)local_318._0_8_ <= dVar31));
              local_280.m_hi =
                   (double)(~-(ulong)(dVar32 <= (double)local_348._0_8_) & (ulong)dVar32 |
                           local_348._0_8_ & -(ulong)(dVar32 <= (double)local_348._0_8_));
              local_1b8 = (undefined1  [8])local_338._0_8_;
              FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              local_1b8 = (undefined1  [8])local_240.m_hi;
              FVar3 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              local_1b8 = (undefined1  [8])local_280.m_lo;
              FVar4 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              local_1b8 = (undefined1  [8])local_280.m_hi;
              FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              tcu::operator-((Interval *)(local_268 + 0x10),&local_240,&local_280);
              local_1b8._0_4_ = local_250.order;
              local_1b8._4_4_ = local_250.type;
              FVar6 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              iVar17 = (FVar6.m_value >> 0x17 & 0xff) - 0x7f;
              iVar16 = -0x7e;
              if ((FVar6.m_value & 0x7fffff) == 0) {
                iVar16 = iVar17;
              }
              if ((FVar6.m_value & 0x7f800000) == 0) {
                iVar17 = iVar16;
              }
              local_1b8._0_4_ = local_248.order;
              local_1b8._4_4_ = local_248.type;
              FVar6 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                                ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_1b8);
              result = local_288;
              uVar15 = local_290;
              iVar16 = local_2f4;
              iVar9 = (FVar6.m_value >> 0x17 & 0xff) - 0x7f;
              iVar13 = -0x7e;
              if ((FVar6.m_value & 0x7fffff) == 0) {
                iVar13 = iVar9;
              }
              uVar27 = -(uint)((FVar2.m_value & 0x7fffff) != 0 && (FVar2.m_value & 0x7f800000) == 0)
              ;
              uVar29 = -(uint)((FVar3.m_value & 0x7fffff) != 0 && (FVar3.m_value & 0x7f800000) == 0)
              ;
              uVar36 = -(uint)((FVar4.m_value & 0x7fffff) != 0 && (FVar4.m_value & 0x7f800000) == 0)
              ;
              uVar37 = -(uint)((FVar5.m_value & 0x7fffff) != 0 && (FVar5.m_value & 0x7f800000) == 0)
              ;
              uVar30 = uVar27 & 0xffffff82 | ~uVar27 & (FVar2.m_value >> 0x17 & 0xff) - 0x7f;
              uVar35 = uVar29 & 0xffffff82 | ~uVar29 & (FVar3.m_value >> 0x17 & 0xff) - 0x7f;
              uVar36 = uVar36 & 0xffffff82 | ~uVar36 & (FVar4.m_value >> 0x17 & 0xff) - 0x7f;
              uVar37 = uVar37 & 0xffffff82 | ~uVar37 & (FVar5.m_value >> 0x17 & 0xff) - 0x7f;
              uVar27 = -(uint)((int)uVar36 < (int)uVar30);
              uVar29 = -(uint)((int)uVar37 < (int)uVar35);
              uVar27 = ~uVar27 & uVar36 | uVar30 & uVar27;
              uVar29 = ~uVar29 & uVar37 | uVar35 & uVar29;
              uVar30 = -(uint)((int)uVar29 < (int)uVar27);
              uVar27 = ~uVar30 & uVar29 | uVar27 & uVar30;
              if ((FVar6.m_value & 0x7f800000) == 0) {
                iVar9 = iVar13;
              }
              iVar17 = uVar27 - iVar17;
              if (iVar17 < 1) {
                iVar17 = 0;
              }
              iVar9 = uVar27 - iVar9;
              iVar13 = local_2b8._0_4_;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              iVar12 = (int)local_290;
              iVar17 = iVar12 - iVar17;
              if (iVar17 < 1) {
                iVar17 = 0;
              }
              iVar9 = iVar12 - iVar9;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              fVar19 = convertFloatFlushToZeroRtn((float)(double)local_250,local_2f4,iVar17);
              local_338._0_8_ = -INFINITY;
              local_348._0_8_ = INFINITY;
              if (!NAN(fVar19)) {
                local_338._0_8_ = (undefined8)fVar19;
                local_348._0_8_ = local_338._0_8_;
              }
              local_318._0_4_ = fVar19;
              local_348._8_8_ = 0;
              local_338._8_8_ = 0;
              fVar19 = convertFloatFlushToZeroRtn(-(float)(double)local_248,iVar16,iVar9);
              dVar31 = INFINITY;
              dVar32 = -INFINITY;
              if (!NAN(fVar19)) {
                dVar31 = (double)-fVar19;
                dVar32 = dVar31;
              }
              local_210.m_hasNaN = NAN((float)local_318._0_4_) || NAN(fVar19);
              local_210.m_lo =
                   (double)(~-(ulong)((double)local_348._0_8_ <= dVar31) & (ulong)dVar31 |
                           local_348._0_8_ & -(ulong)((double)local_348._0_8_ <= dVar31));
              local_210.m_hi =
                   (double)(~-(ulong)(dVar32 <= (double)local_338._0_8_) & (ulong)dVar32 |
                           local_338._0_8_ & -(ulong)(dVar32 <= (double)local_338._0_8_));
              local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
              uStack_1b0 = 3.0;
              dStack_1a8 = 3.0;
              tcu::operator/(&local_1d0,&local_210,(Interval *)local_1b8);
              fVar19 = addErrorUlp((float)local_1d0.m_lo,-2.5,iVar12);
              fVar19 = convertFloatFlushToZeroRtn(fVar19,iVar16,iVar12);
              iVar17 = local_34c;
              local_338._0_8_ = -INFINITY;
              local_348._0_8_ = INFINITY;
              if (!NAN(fVar19)) {
                local_338._0_8_ = (undefined8)fVar19;
                local_348._0_8_ = local_338._0_8_;
              }
              local_348._8_8_ = 0;
              local_338._8_8_ = 0;
              fVar19 = addErrorUlp((float)local_1d0.m_hi,2.5,iVar12);
              fVar19 = convertFloatFlushToZeroRtn(-fVar19,iVar16,iVar12);
              dVar32 = -INFINITY;
              dVar31 = INFINITY;
              if (!NAN(fVar19)) {
                dVar32 = (double)-fVar19;
                dVar31 = dVar32;
              }
              dVar28 = (double)(~-(ulong)((double)local_348._0_8_ <= dVar31) & (ulong)dVar31 |
                               local_348._0_8_ & -(ulong)((double)local_348._0_8_ <= dVar31)) -
                       (double)surfaceThreshold->m_data[local_328];
              dVar31 = INFINITY;
              uVar25 = 0;
              if (!NAN(dVar28)) {
                dVar31 = dVar28;
                uVar25 = local_348._8_8_;
              }
              dVar33 = (double)(~-(ulong)(dVar32 <= (double)local_338._0_8_) & (ulong)dVar32 |
                               local_338._0_8_ & -(ulong)(dVar32 <= (double)local_338._0_8_)) +
                       (double)surfaceThreshold->m_data[local_328];
              dVar32 = INFINITY;
              if (!NAN(dVar33)) {
                dVar32 = dVar33;
              }
              dVar28 = (double)(-(ulong)NAN(dVar28) & 0xfff0000000000000 |
                               ~-(ulong)NAN(dVar28) & (ulong)dVar28);
              dVar33 = (double)(-(ulong)NAN(dVar33) & 0xfff0000000000000 |
                               ~-(ulong)NAN(dVar33) & (ulong)dVar33);
              local_338._0_8_ =
                   ~-(ulong)(dVar31 <= dVar32) & (ulong)dVar32 |
                   (ulong)dVar31 & -(ulong)(dVar31 <= dVar32);
              uVar18 = -(ulong)(dVar33 <= dVar28);
              dVar32 = (double)(~uVar18 & (ulong)dVar33 | uVar18 & (ulong)dVar28);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = dVar32;
              auVar24._0_8_ = (double)*(float *)(local_228 + local_328 * 4);
              auVar24._8_8_ = 0;
              local_338._8_8_ = uVar25;
              if ((auVar24._0_8_ < (double)local_338._0_8_) || (dVar32 < auVar24._0_8_)) {
                pVVar8 = surfaceThreshold;
                local_348 = auVar24;
                local_318 = auVar34;
                if (iVar13 < 10) {
                  local_1b8._0_4_ = local_308.order;
                  local_1b8._4_4_ = local_308.type;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"Error in pixel at ",0x12);
                  std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar17);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
                  std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)local_358);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0," with component ",0x10);
                  std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)local_328);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0," (channel ",10);
                  local_268[0] = "2d_rgba"[local_328 + 3];
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,local_268,1);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,")\n",2)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"\tGot pixel value ",0x11);
                  tcu::ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)local_268,(int)result,iVar17,(int)local_358);
                  tcu::operator<<((ostream *)&uStack_1b0,(Vector<int,_4> *)local_268);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"\t\tdFd",5);
                  local_359 = derivateFunc == DERIVATE_DFDX ^ 0x79;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,(char *)&local_359,1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0," ~= ",4);
                  std::ostream::_M_insert<double>((double)local_348._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"\t\tdifference to a valid range: ",0x1f);
                  pcVar14 = "-";
                  if ((double)local_338._0_8_ <= (double)local_348._0_8_) {
                    pcVar14 = "+";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,pcVar14,1);
                  uVar18 = -(ulong)((double)local_348._0_8_ < local_338._0_8_);
                  std::ostream::_M_insert<double>
                            ((double)(~uVar18 & (ulong)((double)local_348._0_8_ -
                                                       (double)local_318._0_8_) |
                                     (ulong)(local_338._0_8_ - (double)local_348._0_8_) & uVar18));
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"\tDerivative value range:\n",0x19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"\t\tMin: ",7);
                  std::ostream::_M_insert<double>((double)local_338._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1b0,"\t\tMax: ",7);
                  std::ostream::_M_insert<double>((double)local_318._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
                  pVVar8 = (Vec4 *)std::ios_base::~ios_base(local_140);
                }
                iVar13 = iVar13 + 1;
                local_2e0 = CONCAT71((int7)((ulong)pVVar8 >> 8),1);
              }
              iVar12 = local_2f8;
              uVar18 = local_328 + 1;
            } while (local_298 != uVar18);
            if ((local_2e0 & 1) != 0) {
              tcu::PixelBufferAccess::setPixel(local_2e8,&local_1e8,local_34c,(int)local_358,0);
            }
          }
          iVar17 = local_34c + 1;
          iVar9 = (result->m_size).m_data[0];
        } while (iVar17 < iVar9);
        iVar17 = (result->m_size).m_data[1];
      }
      uVar27 = (int)local_358 + 1;
      local_358 = (ulong)uVar27;
    } while ((int)uVar27 < iVar17);
    if (iVar13 < 10) {
      if (iVar13 < 1) goto LAB_0064c891;
    }
    else {
      local_1b8._0_4_ = local_308.order;
      local_1b8._4_4_ = local_308.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"...",3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    local_1b8._0_4_ = local_308.order;
    local_1b8._4_4_ = local_308.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"FAIL: found ",0xc);
    std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0," failed pixels",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
LAB_0064c891:
  return iVar13 == 0;
}

Assistant:

static bool reverifyConstantDerivateWithFlushRelaxations (tcu::TestLog&							log,
														  const tcu::ConstPixelBufferAccess&	result,
														  const tcu::PixelBufferAccess&			errorMask,
														  glu::DataType							dataType,
														  glu::Precision						precision,
														  const tcu::Vec4&						derivScale,
														  const tcu::Vec4&						derivBias,
														  const tcu::Vec4&						surfaceThreshold,
														  DerivateFunc							derivateFunc,
														  const Linear2DFunctionEvaluator&		function)
{
	DE_ASSERT(result.getWidth() == errorMask.getWidth());
	DE_ASSERT(result.getHeight() == errorMask.getHeight());
	DE_ASSERT(derivateFunc == DERIVATE_DFDX || derivateFunc == DERIVATE_DFDY);

	const tcu::IVec4	red						(255, 0, 0, 255);
	const tcu::IVec4	green					(0, 255, 0, 255);
	const float			divisionErrorUlps		= 2.5f;

	const int			numComponents			= glu::getDataTypeFloatScalars(dataType);
	const int			numBits					= getNumMantissaBits(precision);
	const int			minExponent				= getMinExponent(precision);

	const int			numVaryingSampleBits	= numBits - INTERPOLATION_LOST_BITS;
	int					numFailedPixels			= 0;

	tcu::clear(errorMask, green);

	// search for failed pixels
	for (int y = 0; y < result.getHeight(); ++y)
	for (int x = 0; x < result.getWidth(); ++x)
	{
		//                 flushToZero?(f2z?(functionValueCurrent) - f2z?(functionValueBefore))
		// flushToZero? ( ------------------------------------------------------------------------ +- 2.5 ULP )
		//                                                  dx

		const tcu::Vec4	resultDerivative		= readDerivate(result, derivScale, derivBias, x, y);

		// sample at the front of the back pixel and the back of the front pixel to cover the whole area of
		// legal sample positions. In general case this is NOT OK, but we know that the target funtion is
		// (mostly*) linear which allows us to take the sample points at arbitrary points. This gets us the
		// maximum difference possible in exponents which are used in error bound calculations.
		// * non-linearity may happen around zero or with very high function values due to subnorms not
		//   behaving well.
		const tcu::Vec4	functionValueForward	= (derivateFunc == DERIVATE_DFDX)
													? (function.evaluateAt((float)x + 2.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y + 2.0f));
		const tcu::Vec4	functionValueBackward	= (derivateFunc == DERIVATE_DFDX)
													? (function.evaluateAt((float)x - 1.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y - 1.0f));

		bool	anyComponentFailed				= false;

		// check components separately
		for (int c = 0; c < numComponents; ++c)
		{
			// Simulate interpolation. Add allowed interpolation error and round to target precision. Allow one half ULP (i.e. correct rounding)
			const tcu::Interval	forwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueForward[c],  -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueForward[c],  +0.5f, numVaryingSampleBits), minExponent, numBits));
			const tcu::Interval	backwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueBackward[c], -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueBackward[c], +0.5f, numVaryingSampleBits), minExponent, numBits));
			const int			maxValueExp				= de::max(de::max(tcu::Float32(forwardComponent.lo()).exponent(),   tcu::Float32(forwardComponent.hi()).exponent()),
																  de::max(tcu::Float32(backwardComponent.lo()).exponent(),  tcu::Float32(backwardComponent.hi()).exponent()));

			// subtraction in numerator will likely cause a cancellation of the most
			// significant bits. Apply error bounds.

			const tcu::Interval	numerator				(forwardComponent - backwardComponent);
			const int			numeratorLoExp			= tcu::Float32(numerator.lo()).exponent();
			const int			numeratorHiExp			= tcu::Float32(numerator.hi()).exponent();
			const int			numeratorLoBitsLost		= de::max(0, maxValueExp - numeratorLoExp); //!< must clamp to zero since if forward and backward components have different
			const int			numeratorHiBitsLost		= de::max(0, maxValueExp - numeratorHiExp); //!< sign, numerator might have larger exponent than its operands.
			const int			numeratorLoBits			= de::max(0, numBits - numeratorLoBitsLost);
			const int			numeratorHiBits			= de::max(0, numBits - numeratorHiBitsLost);

			const tcu::Interval	numeratorRange			(convertFloatFlushToZeroRtn((float)numerator.lo(), minExponent, numeratorLoBits),
														 convertFloatFlushToZeroRtp((float)numerator.hi(), minExponent, numeratorHiBits));

			const tcu::Interval	divisionRange			= numeratorRange / 3.0f; // legal sample area is anywhere within this and neighboring pixels (i.e. size = 3)
			const tcu::Interval	divisionResultRange		(convertFloatFlushToZeroRtn(addErrorUlp((float)divisionRange.lo(), -divisionErrorUlps, numBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)divisionRange.hi(), +divisionErrorUlps, numBits), minExponent, numBits));
			const tcu::Interval	finalResultRange		(divisionResultRange.lo() - surfaceThreshold[c], divisionResultRange.hi() + surfaceThreshold[c]);

			if (resultDerivative[c] >= finalResultRange.lo() && resultDerivative[c] <= finalResultRange.hi())
			{
				// value ok
			}
			else
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES)
					log << tcu::TestLog::Message
						<< "Error in pixel at " << x << ", " << y << " with component " << c << " (channel " << ("rgba"[c]) << ")\n"
						<< "\tGot pixel value " << result.getPixelInt(x, y) << "\n"
						<< "\t\tdFd" << ((derivateFunc == DERIVATE_DFDX) ? ('x') : ('y')) << " ~= " << resultDerivative[c] << "\n"
						<< "\t\tdifference to a valid range: "
							<< ((resultDerivative[c] < finalResultRange.lo()) ? ("-") : ("+"))
							<< ((resultDerivative[c] < finalResultRange.lo()) ? (finalResultRange.lo() - resultDerivative[c]) : (resultDerivative[c] - finalResultRange.hi()))
							<< "\n"
						<< "\tDerivative value range:\n"
						<< "\t\tMin: " << finalResultRange.lo() << "\n"
						<< "\t\tMax: " << finalResultRange.hi() << "\n"
						<< tcu::TestLog::EndMessage;

				++numFailedPixels;
				anyComponentFailed = true;
			}
		}

		if (anyComponentFailed)
			errorMask.setPixel(red, x, y);
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}